

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::sendDisconnect(CoreBroker *this,action_t disconnectType)

{
  anon_class_16_2_633b6e1b F;
  ActionMessage *in_RDI;
  ActionMessage bye;
  BaseTimeCoordinator *in_stack_00000110;
  action_t in_stack_ffffffffffffff1c;
  ActionMessage *in_stack_ffffffffffffff20;
  GlobalBrokerId id;
  GlobalFederateId in_stack_ffffffffffffff34;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff44;
  BrokerBase *in_stack_ffffffffffffff50;
  
  ActionMessage::ActionMessage(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  id.gid = (in_RDI->dest_handle).hid;
  GlobalFederateId::GlobalFederateId((GlobalFederateId *)&stack0xffffffffffffff34,id);
  F.bye._0_4_ = in_stack_ffffffffffffff34.gid;
  F.this = (CoreBroker *)in_stack_ffffffffffffff38;
  F.bye._4_4_ = in_stack_ffffffffffffff44;
  gmlc::containers::
  DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>::
  apply<helics::CoreBroker::sendDisconnect(helics::action_message_def::action_t)::__0>
            ((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
              *)CONCAT44(in_stack_ffffffffffffff34.gid,id.gid),F);
  if (((ulong)in_RDI[2].stringData.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start & 0x100) != 0) {
    CLI::std::
    unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>::
    operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                *)0x5ea9a9);
    BaseTimeCoordinator::disconnect(in_stack_00000110);
  }
  if (((ulong)in_RDI[2].stringData.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish & 1) != 0) {
    BrokerBase::writeProfilingData(in_stack_ffffffffffffff50);
  }
  ActionMessage::~ActionMessage(in_RDI);
  return;
}

Assistant:

void CoreBroker::sendDisconnect(action_message_def::action_t disconnectType)
{
    ActionMessage bye(disconnectType);
    bye.source_id = global_broker_id_local;
    mBrokers.apply([this, &bye](auto& brk) {
        if (brk.state < ConnectionState::DISCONNECTED) {
            if (brk.parent == global_broker_id_local) {
                this->routeMessage(bye, brk.global_id);
                brk.state = ConnectionState::DISCONNECTED;
                brk._sent_disconnect_ack = true;
            }
            if (hasTimeDependency) {
                timeCoord->removeDependency(brk.global_id);
                timeCoord->removeDependent(brk.global_id);
            }
        } else if (brk.state == ConnectionState::DISCONNECTED) {
            if (brk._sent_disconnect_ack == false) {
                ActionMessage dis((brk._core) ? CMD_DISCONNECT_CORE_ACK :
                                                CMD_DISCONNECT_BROKER_ACK);
                dis.source_id = global_broker_id_local;
                dis.dest_id = brk.global_id;
                transmit(brk.route, dis);
                brk._sent_disconnect_ack = true;
            }
        }
    });
    if (hasTimeDependency) {
        timeCoord->disconnect();
    }
    if (enable_profiling) {
        writeProfilingData();
    }
}